

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segments.cpp
# Opt level: O2

ssize_t __thiscall r_comp::ObjectMap::read(ObjectMap *this,int __fd,void *__buf,size_t __nbytes)

{
  ssize_t in_RAX;
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  size_t i;
  void *pvVar1;
  
  for (pvVar1 = (void *)0x0; __buf != pvVar1; pvVar1 = (void *)((long)pvVar1 + 1)) {
    r_code::vector<unsigned_int>::push_back
              (&this->objects,*(uint *)(CONCAT44(in_register_00000034,__fd) + (long)pvVar1 * 4));
    in_RAX = extraout_RAX;
  }
  return in_RAX;
}

Assistant:

void ObjectMap::read(uint32_t *data, size_t size)
{
    for (size_t i = 0; i < size; ++i) {
        objects.push_back(data[i]);
    }
}